

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O3

bool __thiscall IceMaths::AABB::ComputePoints(AABB *this,Point *pts)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (pts != (Point *)0x0) {
    fVar6 = (this->mCenter).x;
    fVar4 = (this->mCenter).y;
    fVar5 = (this->mCenter).z;
    fVar3 = (this->mExtents).x;
    uVar1 = (this->mExtents).y;
    uVar2 = (this->mExtents).z;
    fVar7 = fVar6 - fVar3;
    fVar8 = fVar4 - (float)uVar1;
    fVar9 = fVar5 - (float)uVar2;
    fVar6 = fVar6 + fVar3;
    fVar4 = fVar4 + (float)uVar1;
    fVar5 = fVar5 + (float)uVar2;
    pts->x = fVar7;
    pts->y = fVar8;
    pts->z = fVar9;
    pts[1].x = fVar6;
    pts[2].z = fVar9;
    pts[3].x = fVar7;
    pts[3].y = fVar4;
    pts[3].z = fVar9;
    pts[1].y = fVar8;
    pts[1].z = fVar9;
    pts[2].x = fVar6;
    pts[2].y = fVar4;
    pts[4].x = fVar7;
    pts[4].y = fVar8;
    pts[4].z = fVar5;
    pts[5].x = fVar6;
    pts[5].y = fVar8;
    pts[5].z = fVar5;
    pts[6].x = fVar6;
    pts[6].y = fVar4;
    pts[6].z = fVar5;
    pts[7].x = fVar7;
    pts[7].y = fVar4;
    pts[7].z = fVar5;
  }
  return pts != (Point *)0x0;
}

Assistant:

bool AABB::ComputePoints(Point* pts)	const
{
	// Checkings
	if(!pts)	return false;

	// Get box corners
	Point min;	GetMin(min);
	Point max;	GetMax(max);

	//     7+------+6			0 = ---
	//     /|     /|			1 = +--
	//    / |    / |			2 = ++-
	//   / 4+---/--+5			3 = -+-
	// 3+------+2 /    y   z	4 = --+
	//  | /    | /     |  /		5 = +-+
	//  |/     |/      |/		6 = +++
	// 0+------+1      *---x	7 = -++

	// Generate 8 corners of the bbox
	pts[0] = Point(min.x, min.y, min.z);
	pts[1] = Point(max.x, min.y, min.z);
	pts[2] = Point(max.x, max.y, min.z);
	pts[3] = Point(min.x, max.y, min.z);
	pts[4] = Point(min.x, min.y, max.z);
	pts[5] = Point(max.x, min.y, max.z);
	pts[6] = Point(max.x, max.y, max.z);
	pts[7] = Point(min.x, max.y, max.z);

	return true;
}